

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

string * __thiscall Database::Escape(string *__return_storage_ptr__,Database *this,string *raw)

{
  size_type sVar1;
  void *pvVar2;
  undefined8 uVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->engine == SQLite) {
    uVar3 = sqlite3_mprintf("%q",(raw->_M_dataplus)._M_p);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    sqlite3_free(uVar3);
  }
  else if (this->engine == MySQL) {
    sVar1 = raw->_M_string_length;
    pvVar2 = operator_new__(sVar1 * 2 + 1);
    mysql_real_escape_string
              (((this->impl)._M_t.
                super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>._M_t.
                super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>.
                super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0,pvVar2,
               (raw->_M_dataplus)._M_p,sVar1);
    std::__cxx11::string::assign((char *)__return_storage_ptr__,(ulong)pvVar2);
    operator_delete__(pvVar2);
  }
  pbVar4 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
  for (pbVar5 = pbVar4; pbVar5 != pbVar4 + __return_storage_ptr__->_M_string_length;
      pbVar5 = pbVar5 + 1) {
    if ((*pbVar5 - 0x23 < 0x1e) && ((0x20000003U >> (*pbVar5 - 0x23 & 0x1f) & 1) != 0)) {
      *pbVar5 = 0x3f;
      pbVar4 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Database::Escape(const std::string& raw)
{
	char *escret;
	unsigned long esclen;
	std::string result;

	switch (this->engine)
	{
#ifdef DATABASE_MYSQL
		case MySQL:
			escret = new char[raw.length()*2+1];
			esclen = mysql_real_escape_string(this->impl->mysql_handle, escret, raw.c_str(), raw.length());
			result.assign(escret, esclen);
			delete[] escret;
			break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
		case SQLite:
			escret = sqlite3_mprintf("%q", raw.c_str());
			result = escret;
			sqlite3_free(escret);
			break;
#endif // DATABASE_SQLITE
	}

	for (std::string::iterator it = result.begin(); it != result.end(); ++it)
	{
		if (*it == '@' || *it == '#' || *it == '$')
		{
			*it = '?';
		}
	}

	return result;
}